

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O3

void Tim_ManSetCoRequired(Tim_Man_t *p,int iCo,float Delay)

{
  Tim_Obj_t *pTVar1;
  int iVar2;
  
  if (p->nCos <= iCo) {
    __assert_fail("iCo < p->nCos",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timTime.c"
                  ,0x9c,"void Tim_ManSetCoRequired(Tim_Man_t *, int, float)");
  }
  iVar2 = p->nTravIds;
  if (p->fUseTravId != 0) {
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else if (p->pCos[iCo].TravId == iVar2) {
      __assert_fail("!p->fUseTravId || !p->nTravIds || p->pCos[iCo].TravId != p->nTravIds",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timTime.c"
                    ,0x9d,"void Tim_ManSetCoRequired(Tim_Man_t *, int, float)");
    }
  }
  pTVar1 = p->pCos;
  pTVar1[iCo].timeReq = Delay;
  pTVar1[iCo].TravId = iVar2;
  return;
}

Assistant:

void Tim_ManSetCoRequired( Tim_Man_t * p, int iCo, float Delay )
{
    assert( iCo < p->nCos );
    assert( !p->fUseTravId || !p->nTravIds || p->pCos[iCo].TravId != p->nTravIds );
    p->pCos[iCo].timeReq = Delay;
    p->pCos[iCo].TravId = p->nTravIds;
}